

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
::clear(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
        *this)

{
  size_t i;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->size_ != 0) {
    uVar2 = this->capacity_;
    if (uVar2 < 0x80) {
      if (uVar2 != 0) {
        lVar3 = 0;
        for (uVar1 = 0; uVar1 != uVar2; uVar1 = uVar1 + 1) {
          if (-1 < this->ctrl_[uVar1]) {
            std::pair<cs_impl::any,_cs_impl::any>::~pair
                      ((pair<cs_impl::any,_cs_impl::any> *)((long)this->slots_ + lVar3));
            uVar2 = this->capacity_;
          }
          lVar3 = lVar3 + 0x10;
        }
        this->size_ = 0;
        memset(this->ctrl_,0x80,uVar2 + 0x10);
        this->ctrl_[uVar2] = -1;
        reset_growth_left(this,this->capacity_);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::clear() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const
			{
				return !size();
			}